

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

bool __thiscall BanMan::IsDiscouraged(BanMan *this,CNetAddr *net_addr)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock5,&this->m_banned_mutex,"m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x55,false);
  CNetAddr::GetAddrBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,net_addr);
  vKey.m_size = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                (long)local_40._M_impl.super__Vector_impl_data._M_start;
  vKey.m_data = local_40._M_impl.super__Vector_impl_data._M_start;
  bVar2 = CRollingBloomFilter::contains(&this->m_discouraged,vKey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::IsDiscouraged(const CNetAddr& net_addr)
{
    LOCK(m_banned_mutex);
    return m_discouraged.contains(net_addr.GetAddrBytes());
}